

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O2

uint glsl_base_type_get_bit_size(glsl_base_type base_type)

{
  if ((base_type < GLSL_TYPE_FUNCTION) &&
     ((0x83fffU >> (base_type & (GLSL_TYPE_INTERFACE|GLSL_TYPE_STRUCT)) & 1) != 0)) {
    return *(uint *)(&DAT_00207350 + (ulong)base_type * 4);
  }
  __assert_fail("!\"unknown base type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.h"
                ,0xbe,"unsigned int glsl_base_type_get_bit_size(const enum glsl_base_type)");
}

Assistant:

static inline unsigned int
glsl_base_type_get_bit_size(const enum glsl_base_type base_type)
{
   switch (base_type) {
   case GLSL_TYPE_BOOL:
      return 1;

   case GLSL_TYPE_INT:
   case GLSL_TYPE_UINT:
   case GLSL_TYPE_FLOAT: /* TODO handle mediump */
   case GLSL_TYPE_SUBROUTINE:
      return 32;

   case GLSL_TYPE_FLOAT16:
   case GLSL_TYPE_UINT16:
   case GLSL_TYPE_INT16:
      return 16;

   case GLSL_TYPE_UINT8:
   case GLSL_TYPE_INT8:
      return 8;

   case GLSL_TYPE_DOUBLE:
   case GLSL_TYPE_INT64:
   case GLSL_TYPE_UINT64:
   case GLSL_TYPE_IMAGE:
   case GLSL_TYPE_SAMPLER:
      return 64;

   default:
      unreachable("unknown base type");
   }

   return 0;
}